

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSynth.c
# Opt level: O0

int Cec_SequentialSynthesisPart(Gia_Man_t *p,Cec_ParSeq_t *pPars)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int *__s;
  abctime aVar8;
  Cec_ParCor_t *pCorPars_1;
  Cec_ParCor_t CorPars_1;
  Cec_ParCor_t *pCorPars;
  Cec_ParCor_t CorPars;
  abctime clk;
  int nClasses;
  int nCountRegs;
  int nCountPis;
  int i;
  int *pReprs;
  int *pMapBack;
  Vec_Int_t *vPart;
  Vec_Ptr_t *vParts;
  Gia_Man_t *pTemp;
  char Buffer [100];
  int fPrintParts;
  Cec_ParSeq_t *pPars_local;
  Gia_Man_t *p_local;
  
  vPart = (Vec_Int_t *)p->vClockDoms;
  CorPars.pFunc = (void *)Abc_Clock();
  iVar2 = Gia_ManObjNum(p);
  __s = (int *)malloc((long)iVar2 << 2);
  iVar2 = Gia_ManObjNum(p);
  memset(__s,0xff,(long)iVar2 << 2);
  _nCountPis = __s;
  for (nCountRegs = 0; iVar2 = nCountRegs, iVar3 = Vec_PtrSize((Vec_Ptr_t *)vPart), iVar2 < iVar3;
      nCountRegs = nCountRegs + 1) {
    pMapBack = (int *)Vec_PtrEntry((Vec_Ptr_t *)vPart,nCountRegs);
    vParts = (Vec_Ptr_t *)
             Gia_ManRegCreatePart(p,(Vec_Int_t *)pMapBack,&nClasses,(int *)((long)&clk + 4),&pReprs)
    ;
    if (0 < nClasses) {
      if (pPars->fUseScorr == 0) {
        if (pPars->fUseLcorr == 0) {
          Gia_ManSeqCleanupClasses
                    ((Gia_Man_t *)vParts,pPars->fConsts,pPars->fEquivs,pPars->fVerbose);
        }
        else {
          Cec_ManCorSetDefaultParams((Cec_ParCor_t *)&pCorPars_1);
          CorPars_1.nLevelMax = 1;
          CorPars_1.nFrames = pPars->nBTLimit;
          CorPars_1.fVerboseFlops = pPars->fVeryVerbose;
          CorPars_1.fUseRings = 1;
          Cec_ManLSCorrespondenceClasses((Gia_Man_t *)vParts,(Cec_ParCor_t *)&pCorPars_1);
        }
      }
      else {
        CorPars_1.pFunc = &pCorPars;
        Cec_ManCorSetDefaultParams((Cec_ParCor_t *)CorPars_1.pFunc);
        *(int *)((long)CorPars_1.pFunc + 0x10) = pPars->nBTLimit;
        *(int *)((long)CorPars_1.pFunc + 0x14) = pPars->nLevelMax;
        *(int *)((long)CorPars_1.pFunc + 0x40) = pPars->fVeryVerbose;
        *(undefined4 *)((long)CorPars_1.pFunc + 0x2c) = 1;
        Cec_ManLSCorrespondenceClasses((Gia_Man_t *)vParts,(Cec_ParCor_t *)CorPars_1.pFunc);
      }
      clk._0_4_ = Gia_TransferMappedClasses((Gia_Man_t *)vParts,pReprs,_nCountPis);
      iVar2 = nCountRegs;
      if (pPars->fVerbose != 0) {
        uVar4 = Vec_IntSize((Vec_Int_t *)pMapBack);
        iVar5 = Gia_ManCiNum((Gia_Man_t *)vParts);
        iVar6 = Vec_IntSize((Vec_Int_t *)pMapBack);
        iVar3 = nClasses;
        uVar1 = clk._4_4_;
        iVar7 = Gia_ManAndNum((Gia_Man_t *)vParts);
        Abc_Print(1,"%3d : Reg = %4d. PI = %4d. (True = %4d. Regs = %4d.) And = %5d. Cl = %5d.\n",
                  (ulong)(uint)iVar2,(ulong)uVar4,(ulong)(uint)(iVar5 - iVar6),(ulong)(uint)iVar3,
                  uVar1,iVar7,(int)clk);
      }
    }
    Gia_ManStop((Gia_Man_t *)vParts);
    if (pReprs != (int *)0x0) {
      free(pReprs);
      pReprs = (int *)0x0;
    }
  }
  Gia_ManNormalizeEquivalences(p,_nCountPis);
  if (_nCountPis != (int *)0x0) {
    free(_nCountPis);
    _nCountPis = (int *)0x0;
  }
  if (pPars->fVerbose != 0) {
    aVar8 = Abc_Clock();
    Abc_PrintTime(1,"Total time",aVar8 - (long)CorPars.pFunc);
  }
  return 1;
}

Assistant:

int Cec_SequentialSynthesisPart( Gia_Man_t * p, Cec_ParSeq_t * pPars )
{
    int fPrintParts = 0;
    char Buffer[100];
    Gia_Man_t * pTemp;
    Vec_Ptr_t * vParts = (Vec_Ptr_t *)p->vClockDoms;
    Vec_Int_t * vPart;
    int * pMapBack, * pReprs;
    int i, nCountPis, nCountRegs;
    int nClasses;
    abctime clk = Abc_Clock();

    // save parameters
    if ( fPrintParts )
    {
        // print partitions
        Abc_Print( 1, "The following clock domains are used:\n" );
        Vec_PtrForEachEntry( Vec_Int_t *, vParts, vPart, i )
        {
            pTemp = Gia_ManRegCreatePart( p, vPart, &nCountPis, &nCountRegs, NULL );
            sprintf( Buffer, "part%03d.aig", i );
            Gia_AigerWrite( pTemp, Buffer, 0, 0 );
            Abc_Print( 1, "part%03d.aig : Reg = %4d. PI = %4d. (True = %4d. Regs = %4d.) And = %5d.\n", 
                i, Vec_IntSize(vPart), Gia_ManCiNum(pTemp)-Vec_IntSize(vPart), nCountPis, nCountRegs, Gia_ManAndNum(pTemp) );
            Gia_ManStop( pTemp );
        }
    }

    // perform sequential synthesis for clock domains
    pReprs = ABC_FALLOC( int, Gia_ManObjNum(p) );
    Vec_PtrForEachEntry( Vec_Int_t *, vParts, vPart, i )
    {
        pTemp = Gia_ManRegCreatePart( p, vPart, &nCountPis, &nCountRegs, &pMapBack );
        if ( nCountPis > 0 ) 
        {
            if ( pPars->fUseScorr )
            {
                Cec_ParCor_t CorPars, * pCorPars = &CorPars;
                Cec_ManCorSetDefaultParams( pCorPars );
                pCorPars->nBTLimit   = pPars->nBTLimit;
                pCorPars->nLevelMax  = pPars->nLevelMax;
                pCorPars->fVerbose   = pPars->fVeryVerbose;
                pCorPars->fUseCSat   = 1;
                Cec_ManLSCorrespondenceClasses( pTemp, pCorPars );
            }
            else if ( pPars->fUseLcorr )
            {
                Cec_ParCor_t CorPars, * pCorPars = &CorPars;
                Cec_ManCorSetDefaultParams( pCorPars );
                pCorPars->fLatchCorr = 1;
                pCorPars->nBTLimit   = pPars->nBTLimit;
                pCorPars->fVerbose   = pPars->fVeryVerbose;
                pCorPars->fUseCSat   = 1;
                Cec_ManLSCorrespondenceClasses( pTemp, pCorPars );
            }
            else
            {
//                pNew = Gia_ManSeqStructSweep( pTemp, pPars->fConsts, pPars->fEquivs, pPars->fVerbose );
//                Gia_ManStop( pNew );
                Gia_ManSeqCleanupClasses( pTemp, pPars->fConsts, pPars->fEquivs, pPars->fVerbose );
            }
//Abc_Print( 1, "Part equivalences = %d.\n", Gia_ManEquivCountLitsAll(pTemp) );
            nClasses = Gia_TransferMappedClasses( pTemp, pMapBack, pReprs );
            if ( pPars->fVerbose )
            {
                Abc_Print( 1, "%3d : Reg = %4d. PI = %4d. (True = %4d. Regs = %4d.) And = %5d. Cl = %5d.\n", 
                    i, Vec_IntSize(vPart), Gia_ManCiNum(pTemp)-Vec_IntSize(vPart), nCountPis, nCountRegs, Gia_ManAndNum(pTemp), nClasses );
            }
        }
        Gia_ManStop( pTemp );
        ABC_FREE( pMapBack );
    }

    // generate resulting equivalences
    Gia_ManNormalizeEquivalences( p, pReprs );
//Abc_Print( 1, "Total equivalences = %d.\n", Gia_ManEquivCountLitsAll(p) );
    ABC_FREE( pReprs );
    if ( pPars->fVerbose )
    {
        Abc_PrintTime( 1, "Total time", Abc_Clock() - clk );
    }
    return 1;
}